

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::UTF16CollationIterator::forwardNumCodePoints
          (UTF16CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  
  pUVar4 = this->pos;
  pUVar2 = this->limit;
  while( true ) {
    if (num < 1) {
      return;
    }
    if (pUVar4 == pUVar2) break;
    UVar1 = *pUVar4;
    if (UVar1 == L'\0' && pUVar2 == (UChar *)0x0) {
      this->limit = pUVar4;
      return;
    }
    pUVar3 = pUVar4 + 1;
    this->pos = pUVar3;
    if ((pUVar3 != pUVar2 && (UVar1 & 0xfc00U) == 0xd800) && ((*pUVar3 & 0xfc00U) == 0xdc00)) {
      this->pos = pUVar4 + 2;
      pUVar3 = pUVar4 + 2;
    }
    pUVar4 = pUVar3;
    num = num + -1;
  }
  return;
}

Assistant:

void
UTF16CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    while(num > 0 && pos != limit) {
        UChar32 c = *pos;
        if(c == 0 && limit == NULL) {
            limit = pos;
            break;
        }
        ++pos;
        --num;
        if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(*pos)) {
            ++pos;
        }
    }
}